

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O3

NodeRange * __thiscall trieste::Match::operator[](Match *this,Token *token)

{
  pointer ppVar1;
  TokenDef *pTVar2;
  size_t sVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  bool bVar7;
  
  sVar3 = this->index;
  ppVar1 = (this->captures).
           super__Vector_base<std::pair<bool,_std::map<trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>_>_>,_std::allocator<std::pair<bool,_std::map<trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar2 = token->def;
  do {
    if (ppVar1[sVar3].first == true) {
      p_Var6 = *(_Base_ptr *)((long)&ppVar1[sVar3].second._M_t._M_impl + 0x10);
      if (p_Var6 != (_Base_ptr)0x0) {
        p_Var4 = (_Base_ptr)((long)&ppVar1[sVar3].second._M_t._M_impl + 8);
        p_Var5 = p_Var4;
        do {
          if (*(TokenDef **)(p_Var6 + 1) >= pTVar2) {
            p_Var5 = p_Var6;
          }
          p_Var6 = (&p_Var6->_M_left)[*(TokenDef **)(p_Var6 + 1) < pTVar2];
        } while (p_Var6 != (_Base_ptr)0x0);
        if ((p_Var5 != p_Var4) && (*(TokenDef **)(p_Var5 + 1) <= pTVar2)) {
          return (NodeRange *)&p_Var5[1]._M_parent;
        }
      }
    }
    bVar7 = sVar3 == 0;
    sVar3 = sVar3 - 1;
    if (bVar7) {
      return &operator[]::empty;
    }
  } while( true );
}

Assistant:

const NodeRange& operator[](const Token& token)
    {
      static const NodeRange empty;

      for (size_t i = index;; i--)
      {
        const auto& [valid, map] = captures[i];
        if (valid)
        {
          auto it = map.find(token);
          if ((it != map.end()))
          {
            return it->second;
          }
        }
        if (i == 0)
          break;
      }

      return empty;
    }